

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_record
          (ModuleParseContext *this,BlockOrRecord *entry,uint index)

{
  pointer puVar1;
  uint64_t id;
  uint64_t *puVar2;
  LLVMContext *this_00;
  MDNode *this_01;
  mapped_type *this_02;
  MDOperand *md_00;
  NamedMDNode *pNVar3;
  mapped_type *ppNVar4;
  mapped_type *ppMVar5;
  Value *value;
  ConstantAsMetadata *pCVar6;
  MDString *pMVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  unsigned_long *op;
  pointer puVar10;
  uint64_t *puVar11;
  char *__ptr;
  bool bVar12;
  size_t sStack_1050;
  MDOperand *md;
  Vector<MDOperand_*> ops;
  
  bVar12 = true;
  switch(entry->id) {
  case 1:
    this_00 = this->context;
    BlockOrRecord::getString_abi_cxx11_((String *)&ops,entry,0);
    bVar12 = true;
    pMVar7 = LLVMContext::
             construct<LLVMBC::MDString,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                       (this_00,&this->module,(String *)&ops);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose((String *)&ops);
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._4_1_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = index;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._5_3_ = 0;
    ppMVar5 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->metadata,(key_type *)&ops);
    *ppMVar5 = &pMVar7->super_MDOperand;
    break;
  case 2:
    puVar10 = (entry->ops).
              super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(entry->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10)) {
      value = get_value(this,puVar10[1],(Type *)0x0,true);
      if (value == (Value *)0x0) {
        p_Var8 = dxil_spv::get_thread_log_callback();
        if (p_Var8 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Null value!\n";
          sStack_1050 = 0x15;
          goto LAB_00173876;
        }
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_5_ = 0xa216575;
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_start._0_5_ = 0x206c6c754e;
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_start._5_3_ = 0x6c6176;
      }
      else {
        md = (MDOperand *)dyn_cast<LLVMBC::Constant>(value);
        if ((Constant *)md != (Constant *)0x0) {
          pCVar6 = LLVMContext::
                   construct<LLVMBC::ConstantAsMetadata,LLVMBC::Module*&,LLVMBC::Constant*&>
                             (this->context,&this->module,(Constant **)&md);
          ops.
          super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
          ._M_impl.super__Vector_impl_data._M_start._4_1_ = 0;
          ops.
          super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = index;
          ops.
          super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
          ._M_impl.super__Vector_impl_data._M_start._5_3_ = 0;
          ppMVar5 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->metadata,(key_type *)&ops);
          *ppMVar5 = &pCVar6->super_MDOperand;
          return true;
        }
        p_Var8 = dxil_spv::get_thread_log_callback();
        if (p_Var8 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Not a constant!\n";
          sStack_1050 = 0x19;
LAB_00173876:
          fwrite(__ptr,sStack_1050,1,_stderr);
          fflush(_stderr);
          goto LAB_00173836;
        }
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_start._0_5_ = 0x6120746f4e;
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_start._5_3_ = 0x6f6320;
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_5_ = 0x6e6174736e;
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_finish._5_3_ = 0xa2174;
        ops.
        super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)ops.
                              super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
      }
      pvVar9 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var8)(pvVar9,Error,(char *)&ops);
    }
    goto LAB_00173836;
  case 3:
  case 5:
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_5_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._5_3_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::reserve
              (&ops,(long)(entry->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(entry->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar1 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (entry->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1;
        puVar10 = puVar10 + 1) {
      md = get_metadata(this,*puVar10 - 1);
      std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::
      push_back(&ops,&md);
    }
    this_01 = LLVMContext::
              construct<LLVMBC::MDNode,LLVMBC::Module*&,std::vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>>
                        (this->context,&this->module,
                         (vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                          *)&ops.
                             super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                        );
    id = this->metadata_tween_id;
    this->metadata_tween_id = id + 1;
    MDNode::set_tween_id(this_01,id);
    Module::add_unnamed_metadata(this->module,this_01);
    md = (MDOperand *)(ulong)index;
    ppMVar5 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->metadata,(key_type *)&md);
    *ppMVar5 = &this_01->super_MDOperand;
    std::_Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::
    ~_Vector_base(&ops.
                   super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
                 );
    goto LAB_001736cd;
  case 4:
    BlockOrRecord::getString_abi_cxx11_((String *)&ops,entry,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&this->current_metadata_name,(String *)&ops);
LAB_001737ce:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&ops);
    break;
  case 6:
    if ((entry->ops).
        super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (entry->ops).
        super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      BlockOrRecord::getString_abi_cxx11_((String *)&ops,entry,1);
      this_02 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->metadata_kind_map,
                             (entry->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (this_02,(String *)&ops);
      goto LAB_001737ce;
    }
LAB_00173836:
    bVar12 = false;
    break;
  case 10:
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_5_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_start._5_3_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
    ops.
    super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::reserve
              ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)&ops,
               (long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar2 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (entry->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
        puVar11 = puVar11 + 1) {
      md_00 = get_metadata(this,*puVar11);
      md = &dyn_cast<LLVMBC::MDNode>(md_00)->super_MDOperand;
      std::vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::push_back
                ((vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *)&ops
                 ,(value_type *)&md);
    }
    pNVar3 = LLVMContext::
             construct<LLVMBC::NamedMDNode,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>&,std::vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>>>
                       (this->context,&this->module,&this->current_metadata_name,
                        (vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                         *)&ops);
    ppNVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->module->named_metadata,&this->current_metadata_name);
    *ppNVar4 = pNVar3;
    md = (MDOperand *)(ulong)index;
    ppMVar5 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->metadata,(key_type *)&md);
    *ppMVar5 = &pNVar3->super_MDOperand;
    std::_Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::
    ~_Vector_base((_Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>
                   *)&ops);
LAB_001736cd:
    bVar12 = true;
  }
  return bVar12;
}

Assistant:

bool ModuleParseContext::parse_metadata_record(const BlockOrRecord &entry, unsigned index)
{
	switch (MetaDataRecord(entry.id))
	{
	case MetaDataRecord::NAME:
	{
		current_metadata_name = entry.getString();
		break;
	}

	case MetaDataRecord::NAMED_NODE:
	{
		Vector<MDNode *> ops;
		ops.reserve(entry.ops.size());
		for (auto &op : entry.ops)
		{
			auto *md = get_metadata(op);
			auto *node = dyn_cast<MDNode>(md);
			ops.push_back(node);
		}

		auto *node = context->construct<NamedMDNode>(module, current_metadata_name, std::move(ops));
		module->add_named_metadata(current_metadata_name, node);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::DISTINCT_NODE:
	case MetaDataRecord::NODE:
	{
		Vector<MDOperand *> ops;
		ops.reserve(entry.ops.size());
		for (auto &op : entry.ops)
		{
			// For some reason, here metadata is indexed with -1?
			auto *md = get_metadata(op - 1);
			ops.push_back(md);
		}

		auto *node = context->construct<MDNode>(module, std::move(ops));
		node->set_tween_id(metadata_tween_id++);
		module->add_unnamed_metadata(node);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::STRING_OLD:
	{
		auto *node = context->construct<MDString>(module, entry.getString());
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::VALUE:
	{
		if (entry.ops.size() < 2)
			return false;

		auto *value = get_value(entry.ops[1], nullptr, true);
		if (!value)
		{
			LOGE("Null value!\n");
			return false;
		}

		auto *constant_value = dyn_cast<Constant>(value);
		if (!constant_value)
		{
			LOGE("Not a constant!\n");
			return false;
		}

		auto *node = context->construct<ConstantAsMetadata>(module, constant_value);
		metadata[index] = node;
		break;
	}

	case MetaDataRecord::KIND:
	{
		if (entry.ops.size() < 1)
			return false;

		metadata_kind_map[entry.ops[0]] = entry.getString(1);
		break;
	}

	default:
		break;
	}

	return true;
}